

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O2

adt_bytearray_t * adt_bytearray_make(uint8_t *pData,uint32_t u32DataLen,uint32_t u32GrowSize)

{
  adt_error_t aVar1;
  adt_bytearray_t *self;
  
  if ((pData != (uint8_t *)0x0) &&
     (self = adt_bytearray_new(u32GrowSize), self != (adt_bytearray_t *)0x0)) {
    aVar1 = adt_bytearray_append(self,pData,u32DataLen);
    if (aVar1 == '\0') {
      return self;
    }
    adt_bytearray_delete(self);
  }
  return (adt_bytearray_t *)0x0;
}

Assistant:

adt_bytearray_t *adt_bytearray_make(const uint8_t *pData, uint32_t u32DataLen, uint32_t u32GrowSize)
{
   if (pData != 0)
   {
      adt_bytearray_t *self = adt_bytearray_new(u32GrowSize);
      if (self != 0)
      {
         adt_error_t errorCode = adt_bytearray_append(self, pData, u32DataLen);
         if (errorCode != ADT_NO_ERROR)
         {
            adt_bytearray_delete(self);
            self = (adt_bytearray_t*) 0;
         }
      }
      return self;
   }
   return (adt_bytearray_t*) 0;
}